

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

wchar_t rd_monsters_aux(chunk *c)

{
  loc grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  bool bVar1;
  int16_t iVar2;
  wchar_t wVar3;
  int iVar4;
  object *poVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  int16_t *ip;
  bitflag *pbVar9;
  element_info *ip_00;
  uint8_t tmp8u;
  uint16_t tmp16u;
  uint16_t limit;
  monster_conflict monster_body;
  char local_88 [88];
  
  wVar3 = L'\0';
  if (player->is_dead == false) {
    rd_u16b(&limit);
    if (z_info->level_monster_max < limit) {
      uVar8 = (ulong)limit;
      pcVar7 = "Too many (%d) monster entries!";
LAB_0015f655:
      pcVar7 = format(pcVar7,uVar8);
      note(pcVar7);
      wVar3 = L'\xffffffff';
    }
    else {
      uVar6 = 1;
      while( true ) {
        if (limit <= uVar6) break;
        memset(&monster_body,0,0x1a0);
        rd_u16b(&tmp16u);
        monster_body.midx = (wchar_t)tmp16u;
        rd_string(local_88,0x50);
        monster_body.race = lookup_monster(local_88);
        if (monster_body.race == (monster_race *)0x0) {
          pcVar7 = format("Monster race %s no longer exists!",local_88);
          note(pcVar7);
          pcVar7 = "Cannot read monster %d";
LAB_0015f653:
          uVar8 = (ulong)uVar6;
          goto LAB_0015f655;
        }
        rd_string(local_88,0x50);
        iVar4 = bcmp(local_88,"none",5);
        if (iVar4 == 0) {
          monster_body.original_race = (monster_race *)0x0;
        }
        else {
          monster_body.original_race = lookup_monster(local_88);
        }
        rd_byte(&tmp8u);
        monster_body.grid.y = (wchar_t)tmp8u;
        rd_byte(&tmp8u);
        monster_body.grid.x = (wchar_t)tmp8u;
        rd_s16b(&monster_body.hp);
        rd_s16b(&monster_body.maxhp);
        rd_byte(&monster_body.mspeed);
        rd_byte(&monster_body.energy);
        rd_byte(&tmp8u);
        ip = monster_body.m_timed;
        for (uVar8 = 0; uVar8 < tmp8u; uVar8 = uVar8 + 1) {
          rd_s16b(ip);
          ip = ip + 1;
        }
        pbVar9 = monster_body.mflag;
        for (uVar8 = 0; uVar8 < mflag_size; uVar8 = uVar8 + 1) {
          rd_byte(pbVar9);
          pbVar9 = pbVar9 + 1;
        }
        pbVar9 = monster_body.known_pstate.flags;
        for (uVar8 = 0; uVar8 < of_size; uVar8 = uVar8 + 1) {
          rd_byte(pbVar9);
          pbVar9 = pbVar9 + 1;
        }
        ip_00 = monster_body.known_pstate.el_info;
        for (uVar8 = 0; uVar8 < elem_max; uVar8 = uVar8 + 1) {
          rd_s16b(&ip_00->res_level);
          ip_00 = ip_00 + 1;
        }
        rd_u16b(&tmp16u);
        poVar5 = monster_body.mimicked_obj;
        if (tmp16u == 0) {
LAB_0015f54c:
          monster_body.mimicked_obj = poVar5;
          bVar1 = false;
        }
        else {
          grid.y = monster_body.grid.y;
          grid.x = monster_body.grid.x;
          for (poVar5 = square_object((chunk_conflict *)c,grid); poVar5 != (object *)0x0;
              poVar5 = poVar5->next) {
            if ((int)poVar5->mimicking_m_idx == (uint)tmp16u) goto LAB_0015f54c;
          }
          bVar1 = true;
        }
        while (poVar5 = rd_item(), poVar5 != (object *)0x0) {
          pile_insert(&monster_body.held_obj,poVar5);
          uVar8 = (ulong)poVar5->oidx;
          if (uVar8 == 0) {
            __assert_fail("obj->oidx",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/load.c"
                          ,0x14c,"_Bool rd_monster(struct chunk *, struct monster *)");
          }
          if (c->objects[uVar8] != (object *)0x0) {
            __assert_fail("c->objects[obj->oidx] == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/load.c"
                          ,0x14d,"_Bool rd_monster(struct chunk *, struct monster *)");
          }
          c->objects[uVar8] = poVar5;
        }
        rd_u16b(&tmp16u);
        monster_body.group_info[0].index = (wchar_t)tmp16u;
        rd_byte(&tmp8u);
        monster_body.group_info[0].role = (monster_group_role)tmp8u;
        rd_u16b(&tmp16u);
        monster_body.group_info[1].index = (wchar_t)tmp16u;
        rd_byte(&tmp8u);
        monster_body.group_info[1].role = (monster_group_role)tmp8u;
        if (bVar1) {
          grid_00.y = monster_body.grid.y;
          grid_00.x = monster_body.grid.x;
          delete_monster(c,grid_00);
        }
        grid_01.y = monster_body.grid.y;
        grid_01.x = monster_body.grid.x;
        iVar2 = place_monster(c,grid_01,(monster *)&monster_body,'\0');
        if (uVar6 != (int)iVar2) {
          pcVar7 = "Cannot place monster %d";
          goto LAB_0015f653;
        }
        uVar6 = uVar6 + 1;
      }
      wVar3 = L'\0';
    }
  }
  return wVar3;
}

Assistant:

static int rd_monsters_aux(struct chunk *c)
{
	int i;
	uint16_t limit;

	/* Only if the player's alive */
	if (player->is_dead)
		return 0;

	/* Read the monster count */
	rd_u16b(&limit);
	if (limit > z_info->level_monster_max) {
		note(format("Too many (%d) monster entries!", limit));
		return (-1);
	}

	/* Read the monsters */
	for (i = 1; i < limit; i++) {
		struct monster *mon;
		struct monster monster_body;

		/* Get local monster */
		mon = &monster_body;
		memset(mon, 0, sizeof(*mon));

		/* Read the monster */
		if (!rd_monster(c, mon)) {
			note(format("Cannot read monster %d", i));
			return (-1);
		}

		/* Place monster in dungeon */
		if (place_monster(c, mon->grid, mon, 0) != i) {
			note(format("Cannot place monster %d", i));
			return (-1);
		}
	}

	return 0;
}